

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FirstMatchAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,AssertionExpr *args,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_1)

{
  FirstMatchAssertionExpr *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_local_1;
  AssertionExpr *args_local;
  BumpAllocator *this_local;
  
  this_00 = (FirstMatchAssertionExpr *)allocate(this,0x28,8);
  ast::FirstMatchAssertionExpr::FirstMatchAssertionExpr(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }